

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O0

ssize_t __thiscall
websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
          (basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this,int __fd,
          void *__buf,size_t __n)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ssize_t extraout_RAX;
  scoped_lock_type lock;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = dynamic_test(this,__fd);
  if (bVar1) {
    poVar2 = std::operator<<(this->m_out,"[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,timestamp);
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"[");
    pcVar3 = elevel::channel_name(__fd);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,(string *)__buf);
    std::operator<<(poVar2,"\n");
    std::ostream::flush();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2d9307);
  return extraout_RAX;
}

Assistant:

void write(level channel, std::string const & msg) {
        scoped_lock_type lock(m_lock);
        if (!this->dynamic_test(channel)) { return; }
        *m_out << "[" << timestamp << "] "
                  << "[" << names::channel_name(channel) << "] "
                  << msg << "\n";
        m_out->flush();
    }